

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O1

string * generateCopyrightMessage(string *__return_storage_ptr__,string *comment)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  void *pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type __pos;
  ulong uVar8;
  string copyrightMessage;
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  char *local_38;
  
  pcVar2 = (comment->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + comment->_M_string_length);
  _Var4._M_p = local_88._M_dataplus._M_p;
  __pos = 0xffffffffffffffff;
  if (local_88._M_string_length != 0) {
    pvVar5 = memchr(local_88._M_dataplus._M_p,10,local_88._M_string_length);
    __pos = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)_Var4._M_p;
  }
  while (__pos != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (&local_88,__pos,1,"\n// ",4);
    _Var4._M_p = local_88._M_dataplus._M_p;
    uVar8 = __pos + 1;
    __pos = 0xffffffffffffffff;
    if (uVar8 <= local_88._M_string_length && local_88._M_string_length - uVar8 != 0) {
      pvVar5 = memchr(local_88._M_dataplus._M_p + uVar8,10,local_88._M_string_length - uVar8);
      __pos = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)_Var4._M_p;
    }
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_88._M_dataplus._M_p,
             local_88._M_dataplus._M_p + local_88._M_string_length);
  local_38 = local_68._M_dataplus._M_p + local_68._M_string_length;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_68._M_dataplus._M_p;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<trimEnd(std::__cxx11::string_const&)::_lambda(char)_1_>>
            (&local_48);
  local_68._M_string_length = (long)local_48 - (long)local_68._M_dataplus._M_p;
  *local_48 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_88,"\n\n// This header is generated from the Khronos Vulkan XML API Registry.");
  trim(&local_68,&local_88);
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,"\n");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string generateCopyrightMessage( std::string const & comment )
{
  std::string copyrightMessage = comment;

  // replace any '\n' with "\n// "
  for ( size_t pos = copyrightMessage.find( '\n' ); pos != std::string::npos; pos = copyrightMessage.find( '\n', pos + 1 ) )
  {
    copyrightMessage.replace( pos, 1, "\n// " );
  }
  // remove any trailing spaces
  copyrightMessage = trimEnd( copyrightMessage );

  // and add a little message on our own
  copyrightMessage += "\n\n// This header is generated from the Khronos Vulkan XML API Registry.";
  return trim( copyrightMessage ) + "\n";
}